

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O3

DdNode * Cudd_bddXorExistAbstract(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  DdNode *pDVar1;
  
  if (((ulong)cube & 1) == 0) {
    pDVar1 = cube;
    do {
      if (manager->one == pDVar1) {
        do {
          manager->reordered = 0;
          pDVar1 = cuddBddXorExistAbstractRecur(manager,f,g,cube);
        } while (manager->reordered == 1);
        return pDVar1;
      }
    } while (((pDVar1->index != 0x7fffffff) &&
             ((pDVar1->type).kids.E == (DdNode *)((ulong)manager->one ^ 1))) &&
            (pDVar1 = (pDVar1->type).kids.T, ((ulong)pDVar1 & 1) == 0));
  }
  fwrite("Error: Can only abstract positive cubes\n",0x28,1,(FILE *)manager->err);
  manager->errorCode = CUDD_INVALID_ARG;
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddXorExistAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *res;

    if (bddCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,
                       "Error: Can only abstract positive cubes\n");
        manager->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddBddXorExistAbstractRecur(manager, f, g, cube);
    } while (manager->reordered == 1);

    return(res);

}